

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadCustomMultiple::ChLoadCustomMultiple
          (ChLoadCustomMultiple *this,shared_ptr<chrono::ChLoadable> *mloadableA,
          shared_ptr<chrono::ChLoadable> *mloadableB,shared_ptr<chrono::ChLoadable> *mloadableC)

{
  vector<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
  *this_00;
  int iVar1;
  
  ChLoadBase::ChLoadBase(&this->super_ChLoadBase);
  this_00 = &this->loadables;
  (this->super_ChLoadBase).super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadCustomMultiple_0116ca68;
  (this->load_Q).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  (this->loadables).
  super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loadables).
  super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->loadables).
  super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->load_Q).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  std::
  vector<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
  ::push_back(this_00,mloadableA);
  std::
  vector<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
  ::push_back(this_00,mloadableB);
  std::
  vector<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
  ::push_back(this_00,mloadableC);
  iVar1 = (*(this->super_ChLoadBase).super_ChObj._vptr_ChObj[7])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&(this->load_Q).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)iVar1);
  return;
}

Assistant:

ChLoadCustomMultiple::ChLoadCustomMultiple(std::shared_ptr<ChLoadable> mloadableA,
                                           std::shared_ptr<ChLoadable> mloadableB,
                                           std::shared_ptr<ChLoadable> mloadableC) {
    loadables.push_back(mloadableA);
    loadables.push_back(mloadableB);
    loadables.push_back(mloadableC);
    load_Q.setZero(LoadGet_ndof_w());
}